

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecMult.c
# Opt level: O2

uint Extra_TruthCanonNPN2(uint uTruth,int nVars,Vec_Int_t *vRes)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  char cVar5;
  int Polarity;
  long lVar6;
  uint uVar7;
  
  if (Extra_TruthCanonNPN2::pPerms != (char **)0x0) {
    if (Extra_TruthCanonNPN2::nVarsOld == nVars) goto LAB_00540615;
    free(Extra_TruthCanonNPN2::pPerms);
    Extra_TruthCanonNPN2::pPerms = (char **)0x0;
  }
  Extra_TruthCanonNPN2::nPerms = Extra_Factorial(nVars);
  Extra_TruthCanonNPN2::pPerms = Extra_Permutations(nVars);
  Extra_TruthCanonNPN2::nVarsOld = nVars;
LAB_00540615:
  bVar1 = (byte)nVars & 0x1f;
  iVar2 = 1 << bVar1;
  cVar5 = (char)iVar2;
  Polarity = 0;
  if (1 << bVar1 < 1) {
    iVar2 = 0;
  }
  uVar7 = 0xffffffff;
  for (; Polarity != iVar2; Polarity = Polarity + 1) {
    uVar3 = Extra_TruthPolarize(uTruth,Polarity,nVars);
    for (lVar6 = 0; lVar6 < Extra_TruthCanonNPN2::nPerms; lVar6 = lVar6 + 1) {
      uVar4 = Extra_TruthPermute(uVar3,Extra_TruthCanonNPN2::pPerms[lVar6],nVars,0);
      if ((uVar4 & 1) == 0) {
        Vec_IntPushUnique(vRes,uVar4);
      }
      if (uVar4 <= uVar7) {
        uVar7 = uVar4;
      }
    }
    uVar3 = Extra_TruthPolarize((~uTruth << (-cVar5 & 0x1fU)) >> (-cVar5 & 0x1fU),Polarity,nVars);
    for (lVar6 = 0; lVar6 < Extra_TruthCanonNPN2::nPerms; lVar6 = lVar6 + 1) {
      uVar4 = Extra_TruthPermute(uVar3,Extra_TruthCanonNPN2::pPerms[lVar6],nVars,0);
      if ((uVar4 & 1) == 0) {
        Vec_IntPushUnique(vRes,uVar4);
      }
      if (uVar4 <= uVar7) {
        uVar7 = uVar4;
      }
    }
  }
  return uVar7;
}

Assistant:

unsigned Extra_TruthCanonNPN2( unsigned uTruth, int nVars, Vec_Int_t * vRes )
{
    static int nVarsOld, nPerms;
    static char ** pPerms = NULL;

    unsigned uTruthMin, uTruthC, uPhase, uPerm;
    int nMints, k, i;

    if ( pPerms == NULL )
    {
        nPerms = Extra_Factorial( nVars );   
        pPerms = Extra_Permutations( nVars );
        nVarsOld = nVars;
    }
    else if ( nVarsOld != nVars )
    {
        ABC_FREE( pPerms );
        nPerms = Extra_Factorial( nVars );   
        pPerms = Extra_Permutations( nVars );
        nVarsOld = nVars;
    }

    nMints    = (1 << nVars);
    uTruthC   = (unsigned)( (~uTruth) & ((~((unsigned)0)) >> (32-nMints)) );
    uTruthMin = 0xFFFFFFFF;
    for ( i = 0; i < nMints; i++ )
    {
        uPhase = Extra_TruthPolarize( uTruth, i, nVars ); 
        for ( k = 0; k < nPerms; k++ )
        {
            uPerm = Extra_TruthPermute( uPhase, pPerms[k], nVars, 0 );
            if ( !(uPerm & 1) )
            Vec_IntPushUnique( vRes, uPerm );
            if ( uTruthMin > uPerm )
                uTruthMin = uPerm;
        }
        uPhase = Extra_TruthPolarize( uTruthC, i, nVars ); 
        for ( k = 0; k < nPerms; k++ )
        {
            uPerm = Extra_TruthPermute( uPhase, pPerms[k], nVars, 0 );
            if ( !(uPerm & 1) )
            Vec_IntPushUnique( vRes, uPerm );
            if ( uTruthMin > uPerm )
                uTruthMin = uPerm;
        }
    }
    return uTruthMin;
}